

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  size_t in_R8;
  int in_R9D;
  char *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_R9D == 0) {
    iVar1 = LZ4_decompress_safe(in_RDI,in_RSI,in_EDX,in_ECX);
  }
  else if ((char *)(in_R8 + (long)in_R9D) == in_RSI) {
    if (in_R9D < 0xffff) {
      iVar1 = LZ4_decompress_safe_withSmallPrefix(in_RDI,in_RSI,in_EDX,in_ECX,in_R8);
    }
    else {
      iVar1 = LZ4_decompress_safe_withPrefix64k(in_RDI,in_RSI,in_EDX,in_ECX);
    }
  }
  else {
    iVar1 = LZ4_decompress_safe_forceExtDict
                      (unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI,CONCAT44(in_EDX,in_ECX));
  }
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}